

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

bool __thiscall cmCTestRunTest::StartAgain(cmCTestRunTest *this,size_t completed)

{
  bool bVar1;
  char *__rhs;
  cmWorkingDirectory workdir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  cmWorkingDirectory local_48;
  
  bVar1 = this->RunAgain;
  if (bVar1 == true) {
    this->RunAgain = false;
    cmWorkingDirectory::cmWorkingDirectory(&local_48,&this->TestProperties->Directory);
    if (local_48.ResultCode == 0) {
      StartTest(this,completed,this->TotalNumberOfTests);
    }
    else {
      std::operator+(&bStack_a8,"Failed to change working directory to ",
                     &this->TestProperties->Directory);
      std::operator+(&local_88,&bStack_a8," : ");
      __rhs = strerror(local_48.ResultCode);
      std::operator+(&local_68,&local_88,__rhs);
      StartFailure(this,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&bStack_a8);
    }
    cmWorkingDirectory::~cmWorkingDirectory(&local_48);
  }
  return bVar1;
}

Assistant:

bool cmCTestRunTest::StartAgain(size_t completed)
{
  if (!this->RunAgain) {
    return false;
  }
  this->RunAgain = false; // reset
  // change to tests directory
  cmWorkingDirectory workdir(this->TestProperties->Directory);
  if (workdir.Failed()) {
    this->StartFailure("Failed to change working directory to " +
                       this->TestProperties->Directory + " : " +
                       std::strerror(workdir.GetLastResult()));
    return true;
  }

  this->StartTest(completed, this->TotalNumberOfTests);
  return true;
}